

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

int __thiscall ON_BoundingBox::IsVisible(ON_BoundingBox *this,ON_Xform *bbox2c)

{
  double dVar1;
  ON_3dPoint *pOVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  bVar3 = ON_IsValid((this->m_min).x);
  iVar6 = 0;
  if ((bVar3) && (bVar3 = ON_IsValid((this->m_max).x), bVar3)) {
    dVar13 = (this->m_min).x;
    dVar1 = (this->m_max).x;
    iVar6 = 0;
    if (dVar13 <= dVar1) {
      uVar5 = 0;
      uVar4 = 0xffffffff;
      iVar6 = 2;
      while (bVar3 = iVar6 != 0, iVar6 = iVar6 + -1, bVar3) {
        dVar17 = dVar13 * bbox2c->m_xform[0][0];
        dVar18 = dVar13 * bbox2c->m_xform[3][0];
        dVar10 = dVar13 * bbox2c->m_xform[1][0];
        dVar14 = dVar13 * bbox2c->m_xform[2][0];
        iVar7 = 2;
        pOVar2 = &this->m_min;
        while( true ) {
          bVar3 = iVar7 == 0;
          iVar7 = iVar7 + -1;
          dVar13 = dVar1;
          if (bVar3) break;
          dVar13 = pOVar2->y;
          iVar8 = -3;
          pOVar2 = &this->m_min;
          while( true ) {
            dVar16 = pOVar2->z;
            iVar8 = iVar8 + 1;
            pOVar2 = &this->m_max;
            if (iVar8 == 0) break;
            dVar11 = dVar16 * bbox2c->m_xform[0][2] + dVar13 * bbox2c->m_xform[0][1] + dVar17 +
                     bbox2c->m_xform[0][3];
            dVar12 = dVar16 * bbox2c->m_xform[3][2] + dVar13 * bbox2c->m_xform[3][1] + dVar18 +
                     bbox2c->m_xform[3][3];
            dVar15 = -dVar12;
            uVar9 = 1;
            if (dVar15 <= dVar11) {
              uVar9 = (uint)(dVar12 < dVar11) * 2;
            }
            dVar11 = dVar16 * bbox2c->m_xform[1][2] + dVar13 * bbox2c->m_xform[1][1] + dVar10 +
                     bbox2c->m_xform[1][3];
            if (dVar15 <= dVar11) {
              if (dVar12 < dVar11) {
                uVar9 = uVar9 | 8;
              }
            }
            else {
              uVar9 = uVar9 | 4;
            }
            dVar16 = dVar16 * bbox2c->m_xform[2][2] + dVar13 * bbox2c->m_xform[2][1] + dVar14 +
                     bbox2c->m_xform[2][3];
            if (dVar15 <= dVar16) {
              if (dVar12 < dVar16) {
                uVar9 = uVar9 | 0x20;
              }
            }
            else {
              uVar9 = uVar9 | 0x10;
            }
            uVar5 = uVar5 | uVar9;
            uVar4 = uVar4 & uVar9;
            pOVar2 = &this->m_max;
            if (uVar4 == 0 && uVar5 != 0) {
              return 1;
            }
          }
        }
      }
      iVar6 = (uint)(uVar4 == 0) * 2;
    }
  }
  return iVar6;
}

Assistant:

int ON_BoundingBox::IsVisible( 
const ON_Xform& bbox2c
) const
{
int i,j,k,n;
unsigned int all_out, some_out, out;
double bx,by,bz,x,w;
const double* p;

  if ( !ON_IsValid(m_min.x) || !ON_IsValid(m_max.x) || m_min.x > m_max.x)
    return 0;

  some_out = 0;    // will be != 0 if some portion of box is outside visible region
  all_out  = 0xFFFFFFFF; // will be == 0 if some portion of box is inside visible region
  p = &bbox2c.m_xform[0][0];
  n = 0; 
  i = 2; bx = m_min.x;
  while(i--)
  {
    j = 2; by = m_min.y;
    while(j--)
    {
      k = 2; bz = m_min.z;
      while(k--)
      {
        w = bx*p[12] + by*p[13] + bz*p[14] + p[15];
        x = bx*p[ 0] + by*p[ 1] + bz*p[ 2] + p[ 3];
        if ( x < -w) out  = 0x01; else if (x > w) out  = 0x02; else out = 0;
        x = bx*p[ 4] + by*p[ 5] + bz*p[ 6] + p[ 7];
        if ( x < -w) out |= 0x04; else if (x > w) out |= 0x08;
        x = bx*p[ 8] + by*p[ 9] + bz*p[10] + p[11];
        if ( x < -w) out |= 0x10; else if (x > w) out |= 0x20;
        some_out |= out;
        all_out  &= out;
        if ( some_out && !all_out )
        {
          // box intersects visible region but is not completely inside it.
          return  1;
        }
        bz = m_max.z;
      }
      by = m_max.y;
    }
    bx = m_max.x;
  }

  return ( all_out ? 0 : 2 );
}